

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O2

intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
__thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>>::
construct<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>const&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,unsigned_long,1ul>>&>
          (pool_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>> *this,
          make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL> *args,
          intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
          *args_1,intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_>
                  *args_2)

{
  void *pvVar1;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,_unsigned_long,_1UL>_> *in_R8;
  refcount_t *refcount;
  make_shared_t<tchecker::ta::state_t,unsigned_long,1ul> *this_00;
  
  pvVar1 = pool_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>::allocate
                     ((pool_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_> *
                      )args);
  if (pvVar1 == (void *)0x0) {
    this_00 = (make_shared_t<tchecker::ta::state_t,unsigned_long,1ul> *)0x0;
  }
  else {
    this_00 = (make_shared_t<tchecker::ta::state_t,unsigned_long,1ul> *)((long)pvVar1 + 8);
    make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>::
    make_shared_t<tchecker::make_shared_t<tchecker::ta::state_t,unsigned_long,1ul>const&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::intval_t,unsigned_long,1ul>>&>
              (this_00,(make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL> *)args_1,
               (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
                *)args_2,in_R8);
  }
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>::
  intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
              *)this,(make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL> *)this_00);
  return (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>
          )(make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL> *)this;
}

Assistant:

tchecker::intrusive_shared_ptr_t<T> construct(ARGS &&... args)
  {
    void * t = allocate();
    if (t == nullptr)
      return tchecker::intrusive_shared_ptr_t<T>(nullptr);
    // p points after the reference counter
    void * p = static_cast<typename T::refcount_t *>(t) + 1;
    try {
      T::construct(p, std::forward<ARGS>(args)...); // construct T in p with args
    }
    catch (...) {
      this->release(t);
      throw;
    }
    return tchecker::intrusive_shared_ptr_t<T>(reinterpret_cast<T *>(p));
  }